

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_listener.c
# Opt level: O1

void ht_tcp_listener_stop(HT_TCPListener *listener)

{
  ht_mutex_lock(listener->_push_action_mutex);
  if (listener->_tcp_server != (HT_TCPServer *)0x0) {
    ht_mutex_unlock(listener->_push_action_mutex);
  }
  ht_listener_buffer_flush(&listener->_buffer,ht_tcp_listener_f_flush,listener);
  ht_tcp_server_stop(listener->_tcp_server);
  ht_listener_buffer_deinit(&listener->_buffer);
  ht_tcp_server_destroy(listener->_tcp_server);
  listener->_tcp_server = (HT_TCPServer *)0x0;
  ht_mutex_unlock(listener->_push_action_mutex);
  ht_mutex_unlock(listener->_push_action_mutex);
  return;
}

Assistant:

void
ht_tcp_listener_stop(HT_TCPListener* listener)
{
    ht_mutex_lock(listener->_push_action_mutex);

    if (!_ht_tcp_listener_is_stopped(listener))
    {
        ht_mutex_unlock(listener->_push_action_mutex);
    }

    ht_tcp_listener_flush(listener);
    ht_tcp_server_stop(listener->_tcp_server);
    ht_listener_buffer_deinit(&listener->_buffer);
    ht_tcp_server_destroy(listener->_tcp_server);
    listener->_tcp_server = NULL;

    ht_mutex_unlock(listener->_push_action_mutex);

    ht_mutex_unlock(listener->_push_action_mutex);
}